

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int recv_message(void)

{
  uint uVar1;
  sockaddr_in addr_from;
  sockaddr_in addr_from_00;
  int iVar2;
  ssize_t sVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  size_type sVar8;
  long lVar9;
  mapped_type_conflict *pmVar10;
  uint uVar11;
  uchar __k [8];
  sockaddr_in addr_from_01;
  sockaddr_in addr_00;
  int local_48;
  int id_message;
  sockaddr_in addr;
  Ip_Port ip_port;
  socklen_t addr_size;
  
  addr_size = 0x10;
  sVar3 = recvfrom(socket_fd,buf,1000000,0,(sockaddr *)&addr,&addr_size);
  iVar2 = rand();
  if (iVar2 % 99 + 1 < precent_lose) {
    fprintf(_stderr,"Bwahaha you just lose new message: %d\n");
    return 0;
  }
  ip_port.second = addr.sin_port;
  sVar4 = std::
          map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
          ::count(&idconnections,&ip_port);
  iVar2 = global_map_id;
  if (sVar4 == 0) {
    pmVar5 = std::
             map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
             ::operator[](&idconnections,&ip_port);
    *pmVar5 = iVar2;
    pmVar6 = std::
             map<int,_sockaddr_in,_std::less<int>,_std::allocator<std::pair<const_int,_sockaddr_in>_>_>
             ::operator[](&connections,&global_map_id);
    pmVar6->sin_family = addr.sin_family;
    pmVar6->sin_port = addr.sin_port;
    (pmVar6->sin_addr).s_addr = addr.sin_addr.s_addr;
    *(undefined4 *)pmVar6->sin_zero = addr.sin_zero._0_4_;
    *(undefined4 *)(pmVar6->sin_zero + 4) = addr.sin_zero._4_4_;
    local_48 = global_map_id;
    global_map_id = global_map_id + 1;
  }
  else {
    pmVar5 = std::
             map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
             ::operator[](&idconnections,&ip_port);
    local_48 = *pmVar5;
  }
  if (sVar3 < 4) {
    fwrite("Bad message size\n",0x11,1,_stderr);
    return -1;
  }
  uVar1 = *buf;
  uVar11 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = *(uint *)((long)buf + 4);
  id_message = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  fprintf(_stderr,"Type message: %d\n",(ulong)uVar11);
  pmVar7 = std::
           map<int,_std::map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>_>_>_>
           ::operator[](&received_messages,&local_48);
  sVar8 = std::
          map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>::
          count(pmVar7,&id_message);
  if (sVar8 != 0) {
    return 0;
  }
  lVar9 = std::chrono::_V2::system_clock::now();
  pmVar7 = std::
           map<int,_std::map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>_>_>_>
           ::operator[](&received_messages,&local_48);
  __k = (uchar  [8])&id_message;
  pmVar10 = std::
            map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>::
            operator[](pmVar7,(key_type *)__k);
  *pmVar10 = lVar9 / 1000;
  switch(uVar11) {
  case 0:
    delete_delivered_message(local_48,id_message);
    return 1;
  case 1:
    addr_00.sin_addr.s_addr = addr.sin_addr.s_addr;
    addr_00.sin_family = addr.sin_family;
    addr_00.sin_port = addr.sin_port;
    addr_00.sin_zero[0] = __k[0];
    addr_00.sin_zero[1] = __k[1];
    addr_00.sin_zero[2] = __k[2];
    addr_00.sin_zero[3] = __k[3];
    addr_00.sin_zero[4] = __k[4];
    addr_00.sin_zero[5] = __k[5];
    addr_00.sin_zero[6] = __k[6];
    addr_00.sin_zero[7] = __k[7];
    iVar2 = handle_message(addr_00,local_48);
    if (iVar2 == 0) {
      return 1;
    }
    break;
  case 2:
    addr_from_01.sin_addr.s_addr = addr.sin_addr.s_addr;
    addr_from_01.sin_family = addr.sin_family;
    addr_from_01.sin_port = addr.sin_port;
    addr_from_01.sin_zero[0] = __k[0];
    addr_from_01.sin_zero[1] = __k[1];
    addr_from_01.sin_zero[2] = __k[2];
    addr_from_01.sin_zero[3] = __k[3];
    addr_from_01.sin_zero[4] = __k[4];
    addr_from_01.sin_zero[5] = __k[5];
    addr_from_01.sin_zero[6] = __k[6];
    addr_from_01.sin_zero[7] = __k[7];
    handle_left(addr_from_01);
    break;
  case 3:
    addr_from_00.sin_addr.s_addr = addr.sin_addr.s_addr;
    addr_from_00.sin_family = addr.sin_family;
    addr_from_00.sin_port = addr.sin_port;
    addr_from_00.sin_zero[0] = addr.sin_zero[0];
    addr_from_00.sin_zero[1] = addr.sin_zero[1];
    addr_from_00.sin_zero[2] = addr.sin_zero[2];
    addr_from_00.sin_zero[3] = addr.sin_zero[3];
    addr_from_00.sin_zero[4] = addr.sin_zero[4];
    addr_from_00.sin_zero[5] = addr.sin_zero[5];
    addr_from_00.sin_zero[6] = addr.sin_zero[6];
    addr_from_00.sin_zero[7] = addr.sin_zero[7];
    handle_parent_message(addr_from_00);
    break;
  case 4:
    flag_root = true;
    fwrite("!!! I am a root now\n",0x14,1,_stderr);
    break;
  case 5:
    addr_from.sin_addr.s_addr = addr.sin_addr.s_addr;
    addr_from.sin_family = addr.sin_family;
    addr_from.sin_port = addr.sin_port;
    addr_from.sin_zero[0] = addr.sin_zero[0];
    addr_from.sin_zero[1] = addr.sin_zero[1];
    addr_from.sin_zero[2] = addr.sin_zero[2];
    addr_from.sin_zero[3] = addr.sin_zero[3];
    addr_from.sin_zero[4] = addr.sin_zero[4];
    addr_from.sin_zero[5] = addr.sin_zero[5];
    addr_from.sin_zero[6] = addr.sin_zero[6];
    addr_from.sin_zero[7] = addr.sin_zero[7];
    handle_child_message(addr_from);
    break;
  default:
    goto switchD_00103821_default;
  }
  send_good_message(local_48,id_message);
switchD_00103821_default:
  return 1;
}

Assistant:

int recv_message() {
    struct sockaddr_in addr;
    socklen_t addr_size = sizeof(struct sockaddr_in);
    ssize_t size = recvfrom(socket_fd, buf, BUFFER_SIZE, 0, (struct sockaddr *) &addr, &addr_size);

    if (rand() % 99 + 1 < precent_lose) {
        fprintf(stderr, "Bwahaha you just lose new message: %d\n", precent_lose);
        return 0;
    }

    Ip_Port ip_port = get_ip_port(addr);
    int current_id;
    if (!idconnections.count(ip_port)) {
        idconnections[ip_port] = global_map_id;
        connections[global_map_id] = addr;
        current_id = global_map_id;
        ++global_map_id;
    }
    else {
        current_id = idconnections[ip_port];
    }

    if (size < 4) {
        fprintf(stderr, "Bad message size\n");
        return -1;
    }

    int type = (int)ntohl(((uint32_t*)buf)[0]);
    int id_message = (int)ntohl(((uint32_t*)buf)[1]);
    fprintf(stderr, "Type message: %d\n", type);

    if (received_messages[current_id].count(id_message)) {
        return 0;
    }
    else {
        auto cur_time = std::chrono::high_resolution_clock::now().time_since_epoch();
        long long ll_cur_time = std::chrono::duration_cast<std::chrono::microseconds>(cur_time).count();
        received_messages[current_id][id_message] = ll_cur_time;
    }

    if (GOODMSG == type) {
        delete_delivered_message(current_id, id_message);
        return 1;
    }

    if (CHILD == type) {
        handle_child_message(addr);
        send_good_message(current_id, id_message);
    }
    else if (PARENT == type) {
        handle_parent_message(addr);
        send_good_message(current_id, id_message);
    }
    else if (ROOT == type) {
        flag_root = true;
        fprintf(stderr, "!!! I am a root now\n");
        send_good_message(current_id, id_message);
    }
    else if (LEFT == type) {
        handle_left(addr);
        send_good_message(current_id, id_message);
    }
    else if (MSG == type) {
        int res = handle_message(addr, current_id);
        if (1 == res) {
            send_good_message(current_id, id_message);
        }
    }

    return 1;
}